

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void flip_bgr(sptr_t colors)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  uchar *puStack_28;
  uchar tmp;
  uchar *p;
  int size;
  int i;
  sptr_t colors_local;
  
  puStack_28 = colors.ptr;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = colors.size;
  for (p._4_4_ = 0; p._4_4_ < (int)colors.size - SUB164(auVar2 % ZEXT816(3),0);
      p._4_4_ = p._4_4_ + 3) {
    uVar1 = *puStack_28;
    *puStack_28 = puStack_28[2];
    puStack_28[2] = uVar1;
    puStack_28 = puStack_28 + 3;
  }
  return;
}

Assistant:

void flip_bgr(sptr_t colors)
{
	int i;
	int size = colors.size - (colors.size % 3);
	unsigned char *p = colors.ptr;
	for (i = 0; i < size; i += 3) {
		unsigned char tmp = *p;
		*p = *(p + 2);
		*(p + 2) = tmp;
		p += 3;
	}
}